

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,string *source,string *destination,MatchProperties match_properties)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  mode_t permissions_00;
  unsigned_long dindex;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  Directory dir;
  mode_t permissions;
  string fromPath;
  Status makedir_status;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  string toPath;
  ostringstream e;
  Directory DStack_268;
  mode_t local_25c;
  string *local_258;
  string *local_250;
  uint local_244;
  string local_240;
  unsigned_long local_208;
  string local_200;
  Status local_1e0;
  mode_t *local_1d8;
  mode_t local_1cc;
  string local_1c8;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  undefined8 local_190;
  undefined1 *local_188;
  undefined8 local_180;
  size_t local_178;
  char *local_170;
  undefined8 local_168;
  ios_base local_138 [264];
  
  local_250 = source;
  bVar2 = cmsys::SystemTools::FileIsDirectory(destination);
  bVar3 = true;
  if (bVar2) {
    bVar3 = cmsys::SystemTools::FileIsSymlink(destination);
  }
  (*this->_vptr_cmFileCopier[5])(this,destination,1,(ulong)bVar3);
  local_1d8 = &local_1cc;
  local_1cc = 0;
  bVar2 = GetDefaultDirectoryPermissions(this,&local_1d8);
  if (bVar2) {
    local_258 = destination;
    local_1e0 = cmsys::SystemTools::MakeDirectory(destination,local_1d8);
    if (local_1e0.Kind_ == Success) {
      local_25c = match_properties.Permissions;
      if ((ulong)match_properties >> 0x20 == 0) {
        local_25c = this->DirPermissions;
      }
      if (local_25c == 0) {
        cmsys::SystemTools::GetPermissions(local_250,&local_25c);
      }
      permissions_00 = local_25c | 0x1c0;
      local_244 = local_25c;
      if ((~local_25c & 0x1c0) == 0) {
        local_244 = 0;
        permissions_00 = local_25c;
      }
      bVar2 = SetPermissions(this,local_258,permissions_00);
      if (bVar2) {
        cmsys::Directory::Directory(&DStack_268);
        if (local_250->_M_string_length != 0) {
          cmsys::Directory::Load(&DStack_268,local_250,(string *)0x0);
        }
        local_208 = cmsys::Directory::GetNumberOfFiles(&DStack_268);
        if (local_208 != 0) {
          dindex = 0;
          do {
            pcVar6 = cmsys::Directory::GetFile(&DStack_268,dindex);
            iVar4 = strcmp(pcVar6,".");
            if (iVar4 != 0) {
              pcVar6 = cmsys::Directory::GetFile(&DStack_268,dindex);
              iVar4 = strcmp(pcVar6,"..");
              if (iVar4 != 0) {
                pcVar6 = cmsys::Directory::GetFile(&DStack_268,dindex);
                local_1a8._8_8_ = (local_250->_M_dataplus)._M_p;
                local_1a8._0_8_ = local_250->_M_string_length;
                local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_240._M_dataplus._M_p = (pointer)0x0;
                local_240._M_string_length = 1;
                local_240.field_2._M_allocated_capacity = (long)&local_240.field_2 + 8;
                local_240.field_2._M_local_buf[8] = '/';
                local_190 = 1;
                local_180 = 0;
                local_188 = (undefined1 *)local_240.field_2._M_allocated_capacity;
                local_178 = strlen(pcVar6);
                local_168 = 0;
                views._M_len = 3;
                views._M_array = (iterator)local_1a8;
                local_170 = pcVar6;
                cmCatViews(&local_200,views);
                pcVar6 = cmsys::Directory::GetFile(&DStack_268,dindex);
                local_1a8._8_8_ = (local_258->_M_dataplus)._M_p;
                local_1a8._0_8_ = local_258->_M_string_length;
                local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_240._M_dataplus._M_p = (char *)0x0;
                local_240._M_string_length = 1;
                local_240.field_2._M_allocated_capacity = (long)&local_240.field_2 + 8;
                local_240.field_2._M_local_buf[8] = '/';
                local_190 = 1;
                local_180 = 0;
                local_188 = (undefined1 *)local_240.field_2._M_allocated_capacity;
                local_178 = strlen(pcVar6);
                local_168 = 0;
                views_00._M_len = 3;
                views_00._M_array = (iterator)local_1a8;
                local_170 = pcVar6;
                cmCatViews(&local_1c8,views_00);
                iVar4 = (*this->_vptr_cmFileCopier[3])(this,&local_200,&local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_dataplus._M_p != &local_200.field_2) {
                  operator_delete(local_200._M_dataplus._M_p,
                                  local_200.field_2._M_allocated_capacity + 1);
                }
                if ((char)iVar4 == '\0') {
                  bVar2 = false;
                  goto LAB_0054e6ea;
                }
              }
            }
            dindex = dindex + 1;
          } while (local_208 != dindex);
        }
        bVar2 = SetPermissions(this,local_258,local_244);
LAB_0054e6ea:
        cmsys::Directory::~Directory(&DStack_268);
        return bVar2;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pcVar6 = this->Name;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)&DStack_268 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0xc0);
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," cannot make directory \"",0x18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_258->_M_dataplus)._M_p,
                          local_258->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\": ",3);
      cmsys::Status::GetString_abi_cxx11_(&local_240,&local_1e0);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_240._M_dataplus._M_p,local_240._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        (ulong)(local_240.field_2._M_allocated_capacity + 1));
      }
      pcVar1 = this->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        (ulong)(local_240.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const std::string& source,
                                    const std::string& destination,
                                    MatchProperties match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !( // Report "Up-to-date:" for existing directories,
                      // but not symlinks to them.
                     cmSystemTools::FileIsDirectory(destination) &&
                     !cmSystemTools::FileIsSymlink(destination)));

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  // Make sure the destination directory exists.
  auto makedir_status =
    cmSystemTools::MakeDirectory(destination, default_dir_mode);
  if (!makedir_status) {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination
      << "\": " << makedir_status.GetString() << ".";
    this->Status.SetError(e.str());
    return false;
  }

  // Compute the requested permissions for the destination directory.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->DirPermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
  }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if ((permissions & required_permissions) == required_permissions) {
    permissions_before = permissions;
  } else {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
  }

  // Set the required permissions of the destination directory.
  if (!this->SetPermissions(destination, permissions_before)) {
    return false;
  }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if (!source.empty()) {
    dir.Load(source);
  }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for (unsigned long fileNum = 0; fileNum < numFiles; ++fileNum) {
    if (!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
          strcmp(dir.GetFile(fileNum), "..") == 0)) {
      std::string fromPath = cmStrCat(source, '/', dir.GetFile(fileNum));
      std::string toPath = cmStrCat(destination, '/', dir.GetFile(fileNum));
      if (!this->Install(fromPath, toPath)) {
        return false;
      }
    }
  }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}